

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

void __thiscall Nibbler::Nibbler(Nibbler *this,Nibbler *other)

{
  size_type sVar1;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  sVar1 = other->_cursor;
  this->_length = other->_length;
  this->_cursor = sVar1;
  return;
}

Assistant:

Nibbler::Nibbler (const Nibbler& other)
: _input (other._input)
, _length (other._length)
, _cursor (other._cursor)
{
}